

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeOneofFields
          (MessageGenerator *this,Printer *p,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields)

{
  pointer ppFVar1;
  pointer ppFVar2;
  FieldDescriptor *field;
  long *plVar3;
  long lVar4;
  long alStack_258 [4];
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
  vStack_238;
  undefined1 *apuStack_210 [2];
  long alStack_200 [2];
  anon_class_1_0_00000001 local_1e9;
  undefined1 local_1e8 [8];
  undefined8 local_1e0;
  ctrl_t local_1d8;
  undefined7 uStack_1d7;
  bool bStack_1d0;
  bool bStack_1cf;
  bool bStack_1ce;
  bool bStack_1cd;
  bool bStack_1cc;
  bool bStack_1cb;
  bool bStack_1ca;
  bool bStack_1c9;
  string local_1c8;
  Printer *local_1a8;
  undefined1 local_1a0 [224];
  Descriptor *pDStack_c0;
  code *local_b8;
  code *local_b0;
  undefined1 local_a8;
  pointer local_a0;
  pointer local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  ppFVar1 = (fields->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppFVar2 = (fields->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_1a8 = p;
  if (ppFVar1 != ppFVar2) {
    field = *ppFVar1;
    if ((long)ppFVar2 - (long)ppFVar1 == 8) {
      GenerateSerializeOneField(this,p,field,-1);
      return;
    }
    if (((byte)field[1] & 0x10) == 0) {
      lVar4 = 0;
    }
    else {
      lVar4 = *(long *)(field + 0x28);
      if (lVar4 == 0) goto LAB_0021007f;
    }
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    alStack_200[0] = 0x20fe6e;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"name","");
    alStack_200[0] = 0x20fe84;
    io::Printer::Sub::Sub<std::__cxx11::string_const&>
              ((Sub *)local_1a0,&local_1c8,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(lVar4 + 8));
    alStack_200[0] = 0x20fead;
    local_1e8 = (undefined1  [8])&local_1d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"cases","");
    local_1a0._184_8_ = local_1a0 + 200;
    if (local_1e8 == (undefined1  [8])&local_1d8) {
      local_1a0[0xd0] = bStack_1d0;
      local_1a0[0xd1] = bStack_1cf;
      local_1a0[0xd2] = bStack_1ce;
      local_1a0[0xd3] = bStack_1cd;
      local_1a0[0xd4] = bStack_1cc;
      local_1a0[0xd5] = bStack_1cb;
      local_1a0[0xd6] = bStack_1ca;
      local_1a0[0xd7] = bStack_1c9;
    }
    else {
      local_1a0._184_8_ = local_1e8;
    }
    local_1a0._192_8_ = local_1e0;
    local_1e0 = (MaybeInitializedPtr)0x0;
    local_1d8 = ~kSentinel;
    alStack_200[0] = 0x20ff0b;
    local_1e8 = (undefined1  [8])&local_1d8;
    local_1a0._216_8_ = operator_new(0x20);
    *(vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      **)local_1a0._216_8_ = fields;
    *(Printer ***)(local_1a0._216_8_ + 8) = &local_1a8;
    *(MessageGenerator **)(local_1a0._216_8_ + 0x10) = this;
    *(undefined1 *)(local_1a0._216_8_ + 0x18) = 0;
    local_b0 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
               ::_M_invoke;
    pDStack_c0 = (Descriptor *)0x0;
    local_b8 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
               ::_M_manager;
    local_a8 = 1;
    local_a0 = (pointer)local_90;
    local_98 = (pointer)0x0;
    local_90[0] = 0;
    local_80 = 0;
    alStack_200[0] = 0x20ff8c;
    std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,0x36a4ec);
    local_38 = 0;
    alStack_200[0] = 0x20ffb1;
    google::protobuf::io::Printer::Emit
              (p,local_1a0,2,0x89,
               "\n            switch (this_.$name$_case()) {\n              $cases$;\n              default:\n                break;\n            }\n          "
              );
    lVar4 = 0x170;
    do {
      if (local_1a0[lVar4 + -8] == '\x01') {
        alStack_200[0] = 0x20ffd8;
        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                  ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                   (local_1e8 + lVar4));
      }
      if ((long *)((long)alStack_200 + lVar4) != *(long **)((long)apuStack_210 + lVar4)) {
        alStack_200[0] = 0x20fff4;
        operator_delete(*(long **)((long)apuStack_210 + lVar4),
                        *(long *)((long)alStack_200 + lVar4) + 1);
      }
      alStack_200[0] = 0x210007;
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
        ::_S_vtable._M_arr[*(byte *)((long)apuStack_210 + lVar4 + -8)]._M_data)
                (&local_1e9,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                  *)((long)&vStack_238.
                            super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                            .
                            super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                            .
                            super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                            .
                            super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                            .
                            super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                            .
                            super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                    + lVar4));
      plVar3 = (long *)((long)alStack_258 + lVar4 + 0x10);
      *(undefined1 *)((long)apuStack_210 + lVar4 + -8) = 0xff;
      if (plVar3 != *(long **)((long)alStack_258 + lVar4)) {
        alStack_200[0] = 0x210027;
        operator_delete(*(long **)((long)alStack_258 + lVar4),*plVar3 + 1);
      }
      lVar4 = lVar4 + -0xb8;
    } while (lVar4 != 0);
    if (local_1e8 != (undefined1  [8])&local_1d8) {
      alStack_200[0] = 0x210047;
      operator_delete((void *)local_1e8,CONCAT71(uStack_1d7,local_1d8) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      alStack_200[0] = 0x210063;
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  alStack_200[0] = 0x21007f;
  GenerateSerializeOneofFields((MessageGenerator *)local_1a0);
LAB_0021007f:
  alStack_200[0] = (long)&LAB_00210097;
  google::protobuf::internal::protobuf_assumption_failed
            ("res != nullptr",
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
             ,0xa9a);
}

Assistant:

void MessageGenerator::GenerateSerializeOneofFields(
    io::Printer* p, const std::vector<const FieldDescriptor*>& fields) {
  ABSL_CHECK(!fields.empty());
  if (fields.size() == 1) {
    GenerateSerializeOneField(p, fields[0], -1);
    return;
  }
  // We have multiple mutually exclusive choices.  Emit a switch statement.
  const OneofDescriptor* oneof = fields[0]->containing_oneof();
  p->Emit({{"name", oneof->name()},
           {"cases",
            [&] {
              for (const auto* field : fields) {
                p->Emit({{"Name", UnderscoresToCamelCase(field->name(), true)},
                         {"body",
                          [&] {
                            field_generators_.get(field)
                                .GenerateSerializeWithCachedSizesToArray(p);
                          }}},
                        R"cc(
                          case k$Name$: {
                            $body$;
                            break;
                          }
                        )cc");
              }
            }}},
          R"cc(
            switch (this_.$name$_case()) {
              $cases$;
              default:
                break;
            }
          )cc");
}